

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O1

void __thiscall duckdb::roaring::RoaringCompressState::FlushSegment(RoaringCompressState *this)

{
  optional_ptr<duckdb::FileBuffer,_true> *this_00;
  idx_t array_containers;
  data_ptr_t pdVar1;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var2;
  ColumnCheckpointState *pCVar3;
  unsigned_long uVar4;
  idx_t iVar5;
  pointer pCVar6;
  data_ptr_t pdVar7;
  pointer *__ptr;
  ContainerMetadataCollection *this_01;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_58;
  BufferHandle *local_50;
  BufferHandle local_48;
  
  pCVar3 = ColumnDataCheckpointData::GetCheckpointState(this->checkpoint_data);
  this_00 = &(this->handle).node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_00);
  pdVar7 = ((this->handle).node.ptr)->buffer + 8;
  this_01 = (ContainerMetadataCollection *)(this->data_ptr + -(long)pdVar7);
  uVar4 = NumericCastImpl<unsigned_long,_long,_false>::Convert((long)this_01);
  iVar5 = (this->metadata_collection).runs_in_segment;
  array_containers = (this->metadata_collection).arrays_in_segment;
  iVar5 = ContainerMetadataCollection::GetMetadataSize
                    (this_01,array_containers + iVar5,iVar5,array_containers);
  pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  if ((pCVar6->super_SegmentBase<duckdb::ColumnSegment>).count.super___atomic_base<unsigned_long>.
      _M_i != 0) {
    local_50 = &this->handle;
    ContainerMetadataCollection::Serialize(&this->metadata_collection,this->data_ptr);
    (this->metadata_collection).count_in_segment = 0;
    (this->metadata_collection).runs_in_segment = 0;
    (this->metadata_collection).arrays_in_segment = 0;
    pdVar1 = this->data_ptr;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_00);
    *(long *)((this->handle).node.ptr)->buffer = (long)pdVar1 - (long)pdVar7;
    local_58._M_head_impl =
         (this->current_segment).
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
    (this->current_segment).
    super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
    super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
    super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
    BufferHandle::BufferHandle(&local_48,local_50);
    (*pCVar3->_vptr_ColumnCheckpointState[4])
              (pCVar3,&local_58,&local_48,iVar5 + (uVar4 + 7 & 0xfffffffffffffff8) + 8);
    BufferHandle::~BufferHandle(&local_48);
    _Var2._M_head_impl = local_58._M_head_impl;
    if (local_58._M_head_impl != (ColumnSegment *)0x0) {
      ColumnSegment::~ColumnSegment(local_58._M_head_impl);
      operator_delete(_Var2._M_head_impl);
    }
  }
  return;
}

Assistant:

void RoaringCompressState::FlushSegment() {
	auto &state = checkpoint_data.GetCheckpointState();
	auto base_ptr = handle.Ptr();
	// +======================================+
	// |x|ddddddddddddddd||mmm|               |
	// +======================================+

	// x: metadata_offset (to the "right" of it)
	// d: data of the containers
	// m: metadata of the containers

	// This is after 'x'
	base_ptr += sizeof(idx_t);

	// Size of the 'd' part
	idx_t data_size = NumericCast<idx_t>(data_ptr - base_ptr);
	data_size = AlignValue(data_size);

	// Size of the 'm' part
	idx_t metadata_size = metadata_collection.GetMetadataSizeForSegment();

	if (current_segment->count.load() == 0) {
		D_ASSERT(metadata_size == 0);
		return;
	}

	idx_t serialized_metadata_size = metadata_collection.Serialize(data_ptr);
	metadata_collection.FlushSegment();
	(void)serialized_metadata_size;
	D_ASSERT(metadata_size == serialized_metadata_size);
	idx_t metadata_start = static_cast<idx_t>(data_ptr - base_ptr);
	Store<idx_t>(metadata_start, handle.Ptr());
	idx_t total_segment_size = sizeof(idx_t) + data_size + metadata_size;
	state.FlushSegment(std::move(current_segment), std::move(handle), total_segment_size);
}